

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project.cpp
# Opt level: O2

string * __thiscall project::get_modules_abi_cxx11_(string *__return_storage_ptr__,project *this)

{
  const_iterator pxVar1;
  const_iterator pxVar2;
  ostream *poVar3;
  char_t *pcVar4;
  xpath_node node;
  xpath_node_set modules;
  stringstream ss;
  xml_node local_208;
  xml_attribute local_200;
  xpath_node local_1f8;
  xpath_node_set local_1e0;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  pugi::xml_node::select_nodes
            (&local_1e0,(xml_node *)this,"/JUCERPROJECT/MODULES/MODULE",(xpath_variable_set *)0x0);
  pxVar1 = pugi::xpath_node_set::begin(&local_1e0);
  while( true ) {
    pxVar2 = pugi::xpath_node_set::end(&local_1e0);
    if (pxVar1 == pxVar2) break;
    local_1f8._node._root = (pxVar1->_node)._root;
    local_1f8._attribute._attr = (pxVar1->_attribute)._attr;
    poVar3 = std::operator<<(local_1a8,"    JuceLibraryCode/include_");
    local_208 = pugi::xpath_node::node(&local_1f8);
    local_200 = pugi::xml_node::attribute(&local_208,"id");
    pcVar4 = pugi::xml_attribute::value(&local_200);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::operator<<(poVar3,".cpp\n");
    pxVar1 = pxVar1 + 1;
  }
  std::__cxx11::stringbuf::str();
  pugi::xpath_node_set::~xpath_node_set(&local_1e0);
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string project::get_modules()
{
    std::stringstream ss;

    pugi::xpath_node_set modules = m_Doc.select_nodes("/JUCERPROJECT/MODULES/MODULE");
    for (pugi::xpath_node_set::const_iterator it = modules.begin(); it != modules.end(); ++it)
    {
        pugi::xpath_node node = *it;
        ss << "    JuceLibraryCode/include_" << node.node().attribute("id").value() << ".cpp\n";
    }

    return ss.str();
}